

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alu.cpp
# Opt level: O1

void aluInit(void)

{
  code *pcVar1;
  
  if (((byte)CPUCapFlags & 1) == 0) {
    pcVar1 = MixDirectHrtf_<CTag>;
  }
  else {
    pcVar1 = MixDirectHrtf_<SSETag>;
  }
  (anonymous_namespace)::MixDirectHrtf = pcVar1;
  return;
}

Assistant:

inline HrtfDirectMixerFunc SelectHrtfMixer(void)
{
#ifdef HAVE_NEON
    if((CPUCapFlags&CPU_CAP_NEON))
        return MixDirectHrtf_<NEONTag>;
#endif
#ifdef HAVE_SSE
    if((CPUCapFlags&CPU_CAP_SSE))
        return MixDirectHrtf_<SSETag>;
#endif

    return MixDirectHrtf_<CTag>;
}